

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O2

int grisu3_print_double(double v,char *dst)

{
  short sVar1;
  int iVar2;
  undefined1 auVar3 [12];
  int iVar4;
  uint uVar5;
  char *buffer;
  long lVar6;
  char *pcVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint64_t ten_kappa;
  ulong uVar12;
  ulong uVar13;
  ulong delta;
  ulong uVar14;
  int iVar15;
  uint val;
  uint uVar16;
  double dVar17;
  ulong rest;
  ulong uVar18;
  int iVar19;
  uint64_t uVar20;
  ulong uVar21;
  bool bVar22;
  double dVar23;
  undefined8 in_XMM0_Qb;
  undefined1 auVar24 [16];
  grisu3_diy_fp_t x;
  grisu3_diy_fp_t x_00;
  grisu3_diy_fp_t x_01;
  grisu3_diy_fp_t x_02;
  grisu3_diy_fp_t x_03;
  grisu3_diy_fp_t gVar25;
  grisu3_diy_fp_t gVar26;
  grisu3_diy_fp_t gVar27;
  grisu3_diy_fp_t y;
  grisu3_diy_fp_t y_00;
  grisu3_diy_fp_t y_01;
  grisu3_diy_fp_t y_02;
  grisu3_diy_fp_t y_03;
  grisu3_diy_fp_t y_04;
  
  auVar24._8_8_ = in_XMM0_Qb;
  auVar24._0_8_ = v;
  if (dst == (char *)0x0) {
    __assert_fail("dst",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_print.h"
                  ,0xd0,"int grisu3_print_double(double, char *)");
  }
  if (0xffe0000000000000 < (ulong)((long)v * 2)) {
    builtin_strncpy(dst,"NaN(",4);
    dst[0x14] = ')';
    dst[0x15] = '\0';
    for (uVar10 = 0xf; -1 < (int)uVar10; uVar10 = uVar10 - 1) {
      dst[(ulong)uVar10 + 4] = grisu3_print_nan_hexdigits[SUB84(v,0) & 0xf];
      v = (double)((ulong)v >> 4);
    }
    return 0x15;
  }
  buffer = dst;
  if ((long)v < 0) {
    *dst = '-';
    auVar24 = auVar24 ^ _DAT_00122160;
    v = ABS(v);
    buffer = dst + 1;
  }
  iVar4 = (int)buffer;
  iVar15 = (int)dst;
  if (v == INFINITY) {
    builtin_strncpy(buffer,"inf",4);
    return (iVar4 - iVar15) + 3;
  }
  if (v == 0.0) {
    buffer[0] = '0';
    buffer[1] = '\0';
    return (iVar4 - iVar15) + 1;
  }
  dVar17 = auVar24._0_8_;
  bVar22 = (auVar24 & (undefined1  [16])0x7ff0000000000000) == (undefined1  [16])0x0;
  uVar18 = ((ulong)dVar17 & 0xfffffffffffff) + 0x10000000000000;
  if (bVar22) {
    uVar18 = (ulong)dVar17 & 0xfffffffffffff;
  }
  iVar19 = -0x432;
  if (!bVar22) {
    iVar19 = ((auVar24._4_4_ & 0x7ff00000) >> 0x14) - 0x433;
  }
  gVar25.e = iVar19;
  gVar25.f = uVar18;
  gVar25._12_4_ = 0;
  gVar25 = grisu3_diy_fp_normalize(gVar25);
  gVar26.e = iVar19 + -1;
  gVar26.f = uVar18 * 2 + 1;
  gVar26._12_4_ = 0;
  gVar26 = grisu3_diy_fp_normalize(gVar26);
  if ((dVar17 <= 0.0) || (1.79769313486232e+308 < dVar17)) {
    __assert_fail("v > 0 && v <= 1.7976931348623157e308",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_print.h"
                  ,0x8a,"int grisu3(double, char *, int *, int *)");
  }
  iVar2 = iVar19 + -2;
  lVar8 = uVar18 << 2;
  if ((auVar24 & (undefined1  [16])0xfffffffffffff) != (undefined1  [16])0x0 ||
      (auVar24 & (undefined1  [16])0x7ff0000000000000) == (undefined1  [16])0x0) {
    iVar2 = iVar19 + -1;
    lVar8 = uVar18 * 2;
  }
  dVar23 = (double)(-0x3d - gVar25.e) * 0.30102999566398114;
  lVar6 = (long)((int)((int)dVar23 + (uint)((double)(int)dVar23 != dVar23 && 0.0 <= dVar23) + 0x15b)
                / 8);
  uVar20 = grisu3_diy_fp_pow_cache[lVar6 + 1].fract;
  iVar19 = (int)grisu3_diy_fp_pow_cache[lVar6 + 1].b_exp;
  sVar1 = grisu3_diy_fp_pow_cache[lVar6 + 1].d_exp;
  gVar27._12_4_ = 0;
  gVar27.f = SUB128(gVar25._0_12_,0);
  gVar27.e = SUB124(gVar25._0_12_,8);
  y.e = iVar19;
  y.f = uVar20;
  y._12_4_ = 0;
  gVar25 = grisu3_diy_fp_multiply(gVar27,y);
  x.e = gVar26.e;
  x.f = lVar8 + -1 << ((char)iVar2 - (char)gVar26.e & 0x3fU);
  x._12_4_ = 0;
  y_00.e = iVar19;
  y_00.f = uVar20;
  y_00._12_4_ = 0;
  gVar27 = grisu3_diy_fp_multiply(x,y_00);
  x_00._12_4_ = 0;
  x_00.f = SUB128(gVar26._0_12_,0);
  x_00.e = SUB124(gVar26._0_12_,8);
  y_01.e = iVar19;
  y_01.f = uVar20;
  y_01._12_4_ = 0;
  gVar26 = grisu3_diy_fp_multiply(x_00,y_01);
  uVar12 = gVar26.f + 1;
  iVar19 = gVar26.e;
  x_01.e = iVar19;
  x_01.f = uVar12;
  x_01._12_4_ = 0;
  y_02.e = gVar27.e;
  y_02.f = gVar27.f - 1;
  y_02._12_4_ = 0;
  gVar26 = grisu3_diy_fp_minus(x_01,y_02);
  delta = gVar26.f;
  bVar9 = -(char)gVar25.e;
  uVar20 = 1;
  ten_kappa = 1L << (bVar9 & 0x3f);
  uVar14 = uVar12 >> (bVar9 & 0x3f);
  uVar18 = ten_kappa - 1;
  rest = uVar18 & uVar12;
  uVar10 = gVar25.e * 0x4d1 + 0x13911 >> 0xc;
  if (grisu3_pow10_cache[(long)(int)uVar10 + 1] <= (uint)uVar14) {
    uVar10 = uVar10 + 1;
  }
  uVar5 = grisu3_pow10_cache[(int)uVar10];
  uVar11 = (int)uVar10 >> 0x1f & uVar10;
  uVar21 = 0;
  for (uVar16 = uVar10; auVar3 = gVar25._0_12_, 0 < (int)uVar16; uVar16 = uVar16 - 1) {
    uVar13 = uVar14 & 0xffffffff;
    uVar14 = uVar13 % (ulong)uVar5;
    buffer[uVar21] = (char)(uVar13 / uVar5) + '0';
    uVar13 = (uVar14 << (bVar9 & 0x3f)) + rest;
    if (uVar13 < delta) {
      uVar11 = (uint)uVar21 + 1;
      uVar18 = (ulong)uVar11;
      x_03.e = iVar19;
      x_03.f = uVar12;
      x_03._12_4_ = 0;
      y_04._12_4_ = 0;
      y_04.f = auVar3._0_8_;
      y_04.e = auVar3._8_4_;
      gVar25 = grisu3_diy_fp_minus(x_03,y_04);
      iVar19 = grisu3_round_weed(buffer,uVar11,gVar25.f,delta,uVar13,(ulong)uVar5 << (bVar9 & 0x3f),
                                 1);
      uVar11 = ~(uint)uVar21 + uVar10;
      goto LAB_00119aa2;
    }
    uVar5 = uVar5 / 10;
    uVar21 = uVar21 + 1;
  }
  do {
    uVar20 = uVar20 * 10;
    delta = delta * 10;
    buffer[uVar21] = (char)(rest * 10 >> (bVar9 & 0x3f)) + '0';
    uVar21 = uVar21 + 1;
    rest = rest * 10 & uVar18;
    uVar11 = uVar11 - 1;
  } while (delta <= rest);
  x_02.e = iVar19;
  x_02.f = uVar12;
  x_02._12_4_ = 0;
  y_03._12_4_ = 0;
  y_03.f = auVar3._0_8_;
  y_03.e = auVar3._8_4_;
  gVar25 = grisu3_diy_fp_minus(x_02,y_03);
  iVar19 = grisu3_round_weed(buffer,(int)uVar21,gVar25.f * uVar20,delta,rest,ten_kappa,uVar20);
  uVar18 = uVar21 & 0xffffffff;
LAB_00119aa2:
  uVar10 = (uint)uVar18;
  if (iVar19 == 0) {
    iVar19 = sprintf(buffer,"%.17g",dVar17);
    return (iVar4 - iVar15) + iVar19;
  }
  val = uVar11 - (int)sVar1;
  uVar16 = -val;
  uVar5 = 1;
  if (2 < (int)uVar10) {
    uVar5 = uVar10 - 1;
  }
  if (SBORROW4(uVar5,uVar16) == (int)(uVar5 + val) < 0) {
    uVar5 = uVar16;
  }
  if ((int)val < 0) {
    if ((-3 < (int)(val + uVar10)) &&
       (uVar10 == uVar16 || SBORROW4(uVar10,uVar16) != (int)(uVar10 + val) < 0)) {
      memmove(buffer + (-(long)(int)uVar10 - (long)(int)val) + 2,buffer,(long)(int)uVar10);
      buffer[0] = '0';
      buffer[1] = '.';
      for (lVar8 = 2; lVar8 < (int)(2 - (val + uVar10)); lVar8 = lVar8 + 1) {
        buffer[lVar8] = '0';
      }
      uVar10 = uVar10 + (int)lVar8;
      goto LAB_00119bd6;
    }
    if (1 < (int)uVar10) {
      lVar8 = 0;
      uVar14 = 0;
      if (0 < (int)uVar5) {
        uVar14 = (ulong)uVar5;
      }
      for (; -lVar8 != uVar14; lVar8 = lVar8 + -1) {
        buffer[lVar8 + uVar18] = buffer[lVar8 + (uVar18 - 1)];
      }
      buffer[(int)(uVar10 - uVar5)] = '.';
      if (val + uVar5 == 0) {
        uVar10 = (uint)(uVar18 + 1);
      }
      else {
        buffer[uVar18 + 1] = 'e';
        iVar19 = grisu3_i_to_str(val + uVar5,buffer + uVar18 + 2);
        uVar10 = uVar10 + iVar19 + 2;
      }
      goto LAB_00119bd6;
    }
  }
  else if (val < 3) {
    if (val != 0) {
      pcVar7 = buffer + (int)uVar10;
      uVar10 = (uVar11 + uVar10) - (int)sVar1;
      for (; 0 < (int)val; val = val - 1) {
        *pcVar7 = '0';
        pcVar7 = pcVar7 + 1;
      }
    }
    goto LAB_00119bd6;
  }
  buffer[(int)uVar10] = 'e';
  iVar19 = grisu3_i_to_str(val,buffer + (int)uVar10 + 1);
  uVar10 = uVar10 + iVar19 + 1;
LAB_00119bd6:
  buffer[(int)uVar10] = '\0';
  return (iVar4 + uVar10) - iVar15;
}

Assistant:

static int grisu3_print_double(double v, char *dst)
{
    int d_exp, len, success, decimals, i;
    uint64_t u64 = grisu3_cast_uint64_from_double(v);
    char *s2 = dst;
    assert(dst);

    /* Prehandle NaNs */
    if ((u64 << 1) > 0xFFE0000000000000ULL) return grisu3_print_nan(u64, dst);
    /* Prehandle negative values. */
    if ((u64 & GRISU3_D64_SIGN) != 0) { *s2++ = '-'; v = -v; u64 ^= GRISU3_D64_SIGN; }
    /* Prehandle zero. */
    if (!u64) { *s2++ = '0'; *s2 = '\0'; return (int)(s2 - dst); }
    /* Prehandle infinity. */
    if (u64 == GRISU3_D64_EXP_MASK) { *s2++ = 'i'; *s2++ = 'n'; *s2++ = 'f'; *s2 = '\0'; return (int)(s2 - dst); }

    success = grisu3(v, s2, &len, &d_exp);
    /* If grisu3 was not able to convert the number to a string, then use old sprintf (suboptimal). */
    if (!success) return sprintf(s2, "%.17g", v) + (int)(s2 - dst);

    /* We now have an integer string of form "151324135" and a base-10 exponent for that number. */
    /* Next, decide the best presentation for that string by whether to use a decimal point, or the scientific exponent notation 'e'. */
    /* We don't pick the absolute shortest representation, but pick a balance between readability and shortness, e.g. */
    /* 1.545056189557677e-308 could be represented in a shorter form */
    /* 1545056189557677e-323 but that would be somewhat unreadable. */
    decimals = GRISU3_MIN(-d_exp, GRISU3_MAX(1, len-1));

    /* mikkelfj:
     * fix zero prefix .1 => 0.1, important for JSON export.
     * prefer unscientific notation at same length:
     * -1.2345e-4 over -1.00012345,
     * -1.0012345 over -1.2345e-3
     */
    if (d_exp < 0 && (len + d_exp) > -3 && len <= -d_exp)
    {
        /* mikkelfj: fix zero prefix .1 => 0.1, and short exponents 1.3e-2 => 0.013. */
        memmove(s2 + 2 - d_exp - len, s2, (size_t)len);
        s2[0] = '0';
        s2[1] = '.';
        for (i = 2; i < 2-d_exp-len; ++i) s2[i] = '0';
        len += i;
    }
    else if (d_exp < 0 && len > 1) /* Add decimal point? */
    {
        for(i = 0; i < decimals; ++i) s2[len-i] = s2[len-i-1];
        s2[len++ - decimals] = '.';
        d_exp += decimals;
        /* Need scientific notation as well? */
        if (d_exp != 0) { s2[len++] = 'e'; len += grisu3_i_to_str(d_exp, s2+len); }
    }
    /* Add scientific notation? */
    else if (d_exp < 0 || d_exp > 2) { s2[len++] = 'e'; len += grisu3_i_to_str(d_exp, s2+len); }
    /* Add zeroes instead of scientific notation? */
    else if (d_exp > 0) { while(d_exp-- > 0) s2[len++] = '0'; }
    s2[len] = '\0'; /* grisu3 doesn't null terminate, so ensure termination. */
    return (int)(s2+len-dst);
}